

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O1

unsigned_long anon_unknown.dwarf_18535::getAttribute<unsigned_long>(xmlNodePtr type,char *att_name)

{
  unsigned_long uVar1;
  bool bVar2;
  char *in_RCX;
  i_interpreter_type i_interpreter;
  unsigned_long local_58;
  undefined **local_50;
  type_info_t *local_48;
  type_info_t *local_40;
  string local_38;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_18;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)type,(xmlNodePtr)att_name,in_RCX);
  local_58 = 0;
  local_48 = (type_info_t *)local_38._M_dataplus._M_p;
  local_40 = (type_info_t *)(local_38._M_dataplus._M_p + local_38._M_string_length);
  local_18.start = local_38._M_dataplus._M_p;
  local_18.finish = (char *)local_40;
  bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_unsigned<unsigned_long>(&local_18,&local_58);
  uVar1 = local_58;
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return uVar1;
  }
  local_50 = &PTR__bad_cast_00113a90;
  local_48 = (type_info_t *)&std::__cxx11::string::typeinfo;
  local_40 = (type_info_t *)&unsigned_long::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_50);
}

Assistant:

T getAttribute(xmlNodePtr type, char const* att_name)
    { return boost::lexical_cast<T>(getStringAttribute(type, att_name)); }